

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops.cc
# Opt level: O0

void google::protobuf::internal::GenericSwap(Message *lhs,Message *rhs)

{
  int iVar1;
  Arena *pAVar2;
  Arena *pAVar3;
  LogMessage *pLVar4;
  undefined4 extraout_var;
  Reflection *this;
  Message *tmp;
  Arena *arena;
  LogMessage local_a0;
  LogFinisher local_65 [20];
  byte local_51;
  LogMessage local_50;
  Message *local_18;
  Message *rhs_local;
  Message *lhs_local;
  Message *message1;
  
  local_18 = rhs;
  rhs_local = lhs;
  pAVar2 = Arena::InternalHelper<google::protobuf::Message>::GetOwningArena(lhs);
  pAVar3 = Arena::InternalHelper<google::protobuf::Message>::GetOwningArena(local_18);
  local_51 = 0;
  if (pAVar2 == pAVar3) {
    LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/reflection_ops.cc"
               ,0x1a8);
    local_51 = 1;
    pLVar4 = LogMessage::operator<<
                       (&local_50,
                        "CHECK failed: Arena::InternalHelper<Message>::GetOwningArena(lhs) != Arena::InternalHelper<Message>::GetOwningArena(rhs): "
                       );
    LogFinisher::operator=(local_65,pLVar4);
  }
  if ((local_51 & 1) != 0) {
    LogMessage::~LogMessage(&local_50);
  }
  pAVar2 = Arena::InternalHelper<google::protobuf::Message>::GetOwningArena(rhs_local);
  arena._7_1_ = 0;
  if ((pAVar2 == (Arena *)0x0) &&
     (pAVar2 = Arena::InternalHelper<google::protobuf::Message>::GetOwningArena(local_18),
     pAVar2 == (Arena *)0x0)) {
    LogMessage::LogMessage
              (&local_a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/reflection_ops.cc"
               ,0x1aa);
    arena._7_1_ = 1;
    pLVar4 = LogMessage::operator<<
                       (&local_a0,
                        "CHECK failed: Arena::InternalHelper<Message>::GetOwningArena(lhs) != nullptr || Arena::InternalHelper<Message>::GetOwningArena(rhs) != nullptr: "
                       );
    LogFinisher::operator=((LogFinisher *)((long)&arena + 6),pLVar4);
  }
  if ((arena._7_1_ & 1) != 0) {
    LogMessage::~LogMessage(&local_a0);
  }
  tmp = (Message *)Arena::InternalHelper<google::protobuf::Message>::GetOwningArena(local_18);
  if ((Arena *)tmp == (Arena *)0x0) {
    std::swap<google::protobuf::Message*>(&rhs_local,&local_18);
    tmp = (Message *)Arena::InternalHelper<google::protobuf::Message>::GetOwningArena(local_18);
  }
  iVar1 = (*(local_18->super_MessageLite)._vptr_MessageLite[3])(local_18,tmp);
  message1 = (Message *)CONCAT44(extraout_var,iVar1);
  (*(message1->super_MessageLite)._vptr_MessageLite[7])(message1,rhs_local);
  (*(rhs_local->super_MessageLite)._vptr_MessageLite[4])();
  (*(rhs_local->super_MessageLite)._vptr_MessageLite[7])(rhs_local,local_18);
  this = Message::GetReflection(local_18);
  Reflection::Swap(this,message1,local_18);
  return;
}

Assistant:

void GenericSwap(Message* lhs, Message* rhs) {
#ifndef PROTOBUF_FORCE_COPY_IN_SWAP
  GOOGLE_DCHECK(Arena::InternalHelper<Message>::GetOwningArena(lhs) !=
         Arena::InternalHelper<Message>::GetOwningArena(rhs));
  GOOGLE_DCHECK(Arena::InternalHelper<Message>::GetOwningArena(lhs) != nullptr ||
         Arena::InternalHelper<Message>::GetOwningArena(rhs) != nullptr);
#endif  // !PROTOBUF_FORCE_COPY_IN_SWAP
  // At least one of these must have an arena, so make `rhs` point to it.
  Arena* arena = Arena::InternalHelper<Message>::GetOwningArena(rhs);
  if (arena == nullptr) {
    std::swap(lhs, rhs);
    arena = Arena::InternalHelper<Message>::GetOwningArena(rhs);
  }

  // Improve efficiency by placing the temporary on an arena so that messages
  // are copied twice rather than three times.
  Message* tmp = rhs->New(arena);
  tmp->CheckTypeAndMergeFrom(*lhs);
  lhs->Clear();
  lhs->CheckTypeAndMergeFrom(*rhs);
#ifdef PROTOBUF_FORCE_COPY_IN_SWAP
  rhs->Clear();
  rhs->CheckTypeAndMergeFrom(*tmp);
  if (arena == nullptr) delete tmp;
#else   // PROTOBUF_FORCE_COPY_IN_SWAP
  rhs->GetReflection()->Swap(tmp, rhs);
#endif  // !PROTOBUF_FORCE_COPY_IN_SWAP
}